

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::MergeFrom
          (TreeEnsembleParameters_TreeNode *this,TreeEnsembleParameters_TreeNode *from)

{
  double dVar1;
  void *pvVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x308);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::TypeHandler>
            (&(this->evaluationinfo_).super_RepeatedPtrFieldBase,
             &(from->evaluationinfo_).super_RepeatedPtrFieldBase);
  if (from->treeid_ != 0) {
    this->treeid_ = from->treeid_;
  }
  if (from->nodeid_ != 0) {
    this->nodeid_ = from->nodeid_;
  }
  if (from->nodebehavior_ != 0) {
    this->nodebehavior_ = from->nodebehavior_;
  }
  if (from->missingvaluetrackstruechild_ == true) {
    this->missingvaluetrackstruechild_ = true;
  }
  if (from->branchfeatureindex_ != 0) {
    this->branchfeatureindex_ = from->branchfeatureindex_;
  }
  dVar1 = from->branchfeaturevalue_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->branchfeaturevalue_ = dVar1;
  }
  if (from->truechildnodeid_ != 0) {
    this->truechildnodeid_ = from->truechildnodeid_;
  }
  if (from->falsechildnodeid_ != 0) {
    this->falsechildnodeid_ = from->falsechildnodeid_;
  }
  dVar1 = from->relativehitrate_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->relativehitrate_ = dVar1;
  }
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode::MergeFrom(const TreeEnsembleParameters_TreeNode& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  evaluationinfo_.MergeFrom(from.evaluationinfo_);
  if (from.treeid() != 0) {
    set_treeid(from.treeid());
  }
  if (from.nodeid() != 0) {
    set_nodeid(from.nodeid());
  }
  if (from.nodebehavior() != 0) {
    set_nodebehavior(from.nodebehavior());
  }
  if (from.missingvaluetrackstruechild() != 0) {
    set_missingvaluetrackstruechild(from.missingvaluetrackstruechild());
  }
  if (from.branchfeatureindex() != 0) {
    set_branchfeatureindex(from.branchfeatureindex());
  }
  if (from.branchfeaturevalue() != 0) {
    set_branchfeaturevalue(from.branchfeaturevalue());
  }
  if (from.truechildnodeid() != 0) {
    set_truechildnodeid(from.truechildnodeid());
  }
  if (from.falsechildnodeid() != 0) {
    set_falsechildnodeid(from.falsechildnodeid());
  }
  if (from.relativehitrate() != 0) {
    set_relativehitrate(from.relativehitrate());
  }
}